

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_SetAssetIssuanceTest_multi_Test::TestBody
          (ConfidentialTransaction_SetAssetIssuanceTest_multi_Test *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar_3;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> asset_amount_list;
  IssuanceParameter local_578;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> asset_script_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> token_amount_list;
  Amount local_4c8;
  AssertionResult gtest_ar_2;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  asset_nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> token_script_list;
  ByteData256 contract_hash;
  Amount local_450;
  Script asset_script1;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  token_nonce_list;
  IssuanceParameter param;
  value_type local_378;
  Script asset_script2;
  value_type local_330;
  ConfidentialTransaction tx;
  value_type local_2e0;
  value_type local_2d0;
  ConfidentialNonce token_nonce1;
  ConfidentialNonce asset_nonce1;
  Script token_script1;
  ConfidentialNonce token_nonce2;
  ConfidentialNonce asset_nonce2;
  ConfidentialTransaction tx_base;
  Script token_script2;
  ConfidentialNonce token_nonce;
  ConfidentialNonce asset_nonce;
  ConfidentialTransaction expect_tx2;
  ConfidentialTransaction expect_tx1;
  Script token_script;
  Script asset_script;
  
  std::__cxx11::string::string
            ((string *)&param,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,(allocator *)&local_578);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx_base,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  std::__cxx11::string::string
            ((string *)&param,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,(allocator *)&local_578);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&expect_tx1,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  std::__cxx11::string::string
            ((string *)&param,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00060135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000001bf08eb00001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc01000000009502f90002074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa160014144f003aa8dd6408ba0e8ee91757cf1f1976315c01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec05010000000017d78400001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec05010000000023c3460002d297469a08ddce74d2954809504da9af5c806ea91aac8f382857b575b006c590160014ae8cab151547d6f6e25b62b41200368dfdabe62b0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb53907700000000000000000000000000"
             ,(allocator *)&local_578);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&expect_tx2,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  asset_script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  asset_script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token_script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  token_script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  token_script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  token_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  token_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,&tx_base);
  AVar4 = cfd::core::Amount::CreateByCoinAmount(100.0);
  local_4c8.amount_ = AVar4.amount_;
  local_4c8.ignore_check_ = AVar4.ignore_check_;
  AVar4 = cfd::core::Amount::CreateByCoinAmount(10.0);
  local_450.amount_ = AVar4.amount_;
  local_450.ignore_check_ = AVar4.ignore_check_;
  std::__cxx11::string::string
            ((string *)&param,"76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac",
             (allocator *)&local_578);
  cfd::core::Script::Script(&asset_script,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  std::__cxx11::string::string
            ((string *)&param,"76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac",
             (allocator *)&local_578);
  cfd::core::Script::Script(&token_script,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&asset_nonce);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&token_nonce);
  cfd::core::ByteData256::ByteData256(&contract_hash);
  cfd::core::IssuanceParameter::IssuanceParameter(&param);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                (&local_578,&tx,0,&local_4c8,&asset_amount_list,&asset_script_list,&asset_nonce_list
                 ,&local_450,&token_amount_list,&token_script_list,&token_nonce_list,false,
                 &contract_hash);
      cfd::core::IssuanceParameter::operator=(&param,&local_578);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_578);
    }
  }
  else {
    testing::Message::Message((Message *)&local_578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&asset_script1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x4e3,
               "Expected: (param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&asset_script1,(Message *)&local_578)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_script1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_578);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_578,&tx.super_AbstractTransaction);
  pp_Var1 = local_578.entropy._vptr_BlindFactor;
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&asset_script1,&expect_tx1.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&asset_script2,"tx.GetHex().c_str()","expect_tx1.GetHex().c_str()",
             (char *)pp_Var1,
             (char *)CONCAT71(asset_script1._vptr_Script._1_7_,(char)asset_script1._vptr_Script));
  std::__cxx11::string::~string((string *)&asset_script1);
  std::__cxx11::string::~string((string *)&local_578);
  if ((char)asset_script2._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_578);
    if (asset_script2.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset_script2.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&asset_script1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x4e4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&asset_script1,(Message *)&local_578)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_script1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_578);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset_script2.script_data_);
  cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_578,&param.entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&asset_script1,"param.entropy.GetHex().c_str()",
             "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"",
             (char *)local_578.entropy._vptr_BlindFactor,
             "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
  std::__cxx11::string::~string((string *)&local_578);
  if ((char)asset_script1._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_578);
    if (asset_script1.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset_script1.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&asset_script2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x4e7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&asset_script2,(Message *)&local_578)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_script2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_578);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset_script1.script_data_);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&local_578,&tx_base);
  cfd::core::ConfidentialTransaction::operator=(&tx,(ConfidentialTransaction *)&local_578);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&local_578);
  AVar4 = cfd::core::Amount::CreateByCoinAmount(75.0);
  local_330.amount_ = AVar4.amount_;
  local_330.ignore_check_ = AVar4.ignore_check_;
  AVar4 = cfd::core::Amount::CreateByCoinAmount(25.0);
  local_2d0.amount_ = AVar4.amount_;
  local_2d0.ignore_check_ = AVar4.ignore_check_;
  std::__cxx11::string::string
            ((string *)&local_578,"76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac",
             (allocator *)&asset_script2);
  cfd::core::Script::Script(&asset_script1,(string *)&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::string
            ((string *)&local_578,"0014144f003aa8dd6408ba0e8ee91757cf1f1976315c",
             (allocator *)&token_script1);
  cfd::core::Script::Script(&asset_script2,(string *)&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&asset_nonce1);
  std::__cxx11::string::string
            ((string *)&local_578,
             "02074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa",
             (allocator *)&token_script1);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&asset_nonce2,(string *)&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  AVar4 = cfd::core::Amount::CreateByCoinAmount(4.0);
  local_378.amount_ = AVar4.amount_;
  local_378.ignore_check_ = AVar4.ignore_check_;
  AVar4 = cfd::core::Amount::CreateByCoinAmount(6.0);
  local_2e0.amount_ = AVar4.amount_;
  local_2e0.ignore_check_ = AVar4.ignore_check_;
  std::__cxx11::string::string
            ((string *)&local_578,"76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac",
             (allocator *)&token_script2);
  cfd::core::Script::Script(&token_script1,(string *)&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::string
            ((string *)&local_578,"0014ae8cab151547d6f6e25b62b41200368dfdabe62b",
             (allocator *)&token_nonce1);
  cfd::core::Script::Script(&token_script2,(string *)&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&token_nonce1);
  std::__cxx11::string::string
            ((string *)&local_578,
             "02d297469a08ddce74d2954809504da9af5c806ea91aac8f382857b575b006c590",
             (allocator *)&gtest_ar_3);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&token_nonce2,(string *)&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&asset_amount_list,&local_330);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&asset_script_list,&asset_script1);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&asset_nonce_list,&asset_nonce1);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&asset_amount_list,&local_2d0);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&asset_script_list,&asset_script2);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&asset_nonce_list,&asset_nonce2);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&token_amount_list,&local_378);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&token_script_list,&token_script1);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&token_nonce_list,&token_nonce1);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&token_amount_list,&local_2e0);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&token_script_list,&token_script2);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&token_nonce_list,&token_nonce2);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetAssetIssuance
                (&local_578,&tx,0,&local_4c8,&asset_amount_list,&asset_script_list,&asset_nonce_list
                 ,&local_450,&token_amount_list,&token_script_list,&token_nonce_list,false,
                 &contract_hash);
      cfd::core::IssuanceParameter::operator=(&param,&local_578);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_578);
    }
  }
  else {
    testing::Message::Message((Message *)&local_578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x508,
               "Expected: (param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_578);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_578,&tx.super_AbstractTransaction);
  pp_Var1 = local_578.entropy._vptr_BlindFactor;
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&gtest_ar_3,&expect_tx2.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"tx.GetHex().c_str()","expect_tx2.GetHex().c_str()",
             (char *)pp_Var1,(char *)CONCAT71(gtest_ar_3._1_7_,gtest_ar_3.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&local_578);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_578);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x509,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_578);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_578,&param.entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"param.entropy.GetHex().c_str()",
             "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"",
             (char *)local_578.entropy._vptr_BlindFactor,
             "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
  std::__cxx11::string::~string((string *)&local_578);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_578);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x50c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_578);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&local_578,&tx_base);
  cfd::core::ConfidentialTransaction::operator=(&tx,(ConfidentialTransaction *)&local_578);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&local_578);
  if (asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear(&asset_script_list);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            (&asset_nonce_list);
  if (token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear(&token_script_list);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            (&token_nonce_list);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&asset_amount_list,&local_4c8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::SetAssetIssuance
              (&local_578,&tx,0,&local_4c8,&asset_amount_list,&asset_script_list,&asset_nonce_list,
               &local_450,&token_amount_list,&token_script_list,&token_nonce_list,false,
               &contract_hash);
    cfd::core::IssuanceParameter::operator=(&param,&local_578);
    cfd::core::IssuanceParameter::~IssuanceParameter(&local_578);
  }
  testing::Message::Message((Message *)&local_578);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x51c,
             "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_578);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_578);
  if (asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&asset_script_list,&asset_script1);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::SetAssetIssuance
              (&local_578,&tx,0,&local_4c8,&asset_amount_list,&asset_script_list,&asset_nonce_list,
               &local_450,&token_amount_list,&token_script_list,&token_nonce_list,false,
               &contract_hash);
    cfd::core::IssuanceParameter::operator=(&param,&local_578);
    cfd::core::IssuanceParameter::~IssuanceParameter(&local_578);
  }
  testing::Message::Message((Message *)&local_578);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x523,
             "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_578);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_578);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear(&asset_script_list);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&token_amount_list,&local_450);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::SetAssetIssuance
              (&local_578,&tx,0,&local_4c8,&asset_amount_list,&asset_script_list,&asset_nonce_list,
               &local_450,&token_amount_list,&token_script_list,&token_nonce_list,false,
               &contract_hash);
    cfd::core::IssuanceParameter::operator=(&param,&local_578);
    cfd::core::IssuanceParameter::~IssuanceParameter(&local_578);
  }
  testing::Message::Message((Message *)&local_578);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x52a,
             "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_578);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_578);
  if (token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&token_script_list,&token_script1);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::SetAssetIssuance
              (&local_578,&tx,0,&local_4c8,&asset_amount_list,&asset_script_list,&asset_nonce_list,
               &local_450,&token_amount_list,&token_script_list,&token_nonce_list,false,
               &contract_hash);
    cfd::core::IssuanceParameter::operator=(&param,&local_578);
    cfd::core::IssuanceParameter::~IssuanceParameter(&local_578);
  }
  testing::Message::Message((Message *)&local_578);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x531,
             "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_578);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_578);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear(&token_script_list);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&asset_amount_list,&local_330);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&asset_script_list,&asset_script1);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&asset_nonce_list,&asset_nonce1);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::SetAssetIssuance
              (&local_578,&tx,0,&local_4c8,&asset_amount_list,&asset_script_list,&asset_nonce_list,
               &local_450,&token_amount_list,&token_script_list,&token_nonce_list,false,
               &contract_hash);
    cfd::core::IssuanceParameter::operator=(&param,&local_578);
    cfd::core::IssuanceParameter::~IssuanceParameter(&local_578);
  }
  testing::Message::Message((Message *)&local_578);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x53d,
             "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_578);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_578);
  if (asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear(&asset_script_list);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            (&asset_nonce_list);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&asset_amount_list,&local_4c8);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&asset_script_list,&asset_script1);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&asset_nonce_list,&asset_nonce1);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            (&token_amount_list,&local_378);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&token_script_list,&token_script1);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&token_nonce_list,&token_nonce1);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::SetAssetIssuance
              (&local_578,&tx,0,&local_4c8,&asset_amount_list,&asset_script_list,&asset_nonce_list,
               &local_450,&token_amount_list,&token_script_list,&token_nonce_list,false,
               &contract_hash);
    cfd::core::IssuanceParameter::operator=(&param,&local_578);
    cfd::core::IssuanceParameter::~IssuanceParameter(&local_578);
  }
  testing::Message::Message((Message *)&local_578);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x54c,
             "Expected: param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list, asset_script_list, asset_nonce_list, token_amount, token_amount_list, token_script_list, token_nonce_list, is_blind, contract_hash) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_578);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_578);
  if (asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         asset_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear(&asset_script_list);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            (&asset_nonce_list);
  if (token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         token_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear(&token_script_list);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            (&token_nonce_list);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&token_nonce2);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&token_nonce1);
  cfd::core::Script::~Script(&token_script2);
  cfd::core::Script::~Script(&token_script1);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&asset_nonce2);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&asset_nonce1);
  cfd::core::Script::~Script(&asset_script2);
  cfd::core::Script::~Script(&asset_script1);
  cfd::core::IssuanceParameter::~IssuanceParameter(&param);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&token_nonce);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&asset_nonce);
  cfd::core::Script::~Script(&token_script);
  cfd::core::Script::~Script(&asset_script);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            (&token_nonce_list);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&token_script_list);
  std::_Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~_Vector_base
            (&token_amount_list.
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            (&asset_nonce_list);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&asset_script_list);
  std::_Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~_Vector_base
            (&asset_amount_list.
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&expect_tx2);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&expect_tx1);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx_base);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetAssetIssuanceTest_multi) {
  ConfidentialTransaction tx_base(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
  ConfidentialTransaction expect_tx1(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
  ConfidentialTransaction expect_tx2(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00060135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000001bf08eb00001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc01000000009502f90002074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa160014144f003aa8dd6408ba0e8ee91757cf1f1976315c01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec05010000000017d78400001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec05010000000023c3460002d297469a08ddce74d2954809504da9af5c806ea91aac8f382857b575b006c590160014ae8cab151547d6f6e25b62b41200368dfdabe62b0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb53907700000000000000000000000000");

  std::vector<Amount> asset_amount_list;
  std::vector<Script> asset_script_list;
  std::vector<ConfidentialNonce> asset_nonce_list;
  std::vector<Amount> token_amount_list;
  std::vector<Script> token_script_list;
  std::vector<ConfidentialNonce> token_nonce_list;

  // empty check
  ConfidentialTransaction tx(tx_base);
  Amount asset_amount = Amount::CreateByCoinAmount(100.0);
  Amount token_amount = Amount::CreateByCoinAmount(10.0);
  Script asset_script("76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac");
  Script token_script("76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac");
  ConfidentialNonce asset_nonce;
  ConfidentialNonce token_nonce;
  ByteData256 contract_hash;
  bool is_blind = false;
  IssuanceParameter param;
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx1.GetHex().c_str());
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");

  // 2-output check
  tx = ConfidentialTransaction(tx_base);
  Amount asset_amount1 = Amount::CreateByCoinAmount(75.0);
  Amount asset_amount2 = Amount::CreateByCoinAmount(25.0);
  Script asset_script1("76a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac");
  Script asset_script2("0014144f003aa8dd6408ba0e8ee91757cf1f1976315c");
  ConfidentialNonce asset_nonce1;
  ConfidentialNonce asset_nonce2("02074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa");
  Amount token_amount1 = Amount::CreateByCoinAmount(4.0);
  Amount token_amount2 = Amount::CreateByCoinAmount(6.0);
  Script token_script1("76a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac");
  Script token_script2("0014ae8cab151547d6f6e25b62b41200368dfdabe62b");
  ConfidentialNonce token_nonce1;
  ConfidentialNonce token_nonce2("02d297469a08ddce74d2954809504da9af5c806ea91aac8f382857b575b006c590");
  asset_amount_list.push_back(asset_amount1);
  asset_script_list.push_back(asset_script1);
  asset_nonce_list.push_back(asset_nonce1);
  asset_amount_list.push_back(asset_amount2);
  asset_script_list.push_back(asset_script2);
  asset_nonce_list.push_back(asset_nonce2);
  token_amount_list.push_back(token_amount1);
  token_script_list.push_back(token_script1);
  token_nonce_list.push_back(token_nonce1);
  token_amount_list.push_back(token_amount2);
  token_script_list.push_back(token_script2);
  token_nonce_list.push_back(token_nonce2);
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx2.GetHex().c_str());
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");

  // error (count unmatch)
  {
    tx = ConfidentialTransaction(tx_base);
    asset_amount_list.clear();
    asset_script_list.clear();
    asset_nonce_list.clear();
    token_amount_list.clear();
    token_script_list.clear();
    token_nonce_list.clear();
    asset_amount_list.push_back(asset_amount);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_amount_list.clear();
    asset_script_list.push_back(asset_script1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_script_list.clear();
    token_amount_list.push_back(token_amount);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    token_amount_list.clear();
    token_script_list.push_back(token_script1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    token_script_list.clear();
  }
  // error (amount unmatch)
  {
    asset_amount_list.push_back(asset_amount1);
    asset_script_list.push_back(asset_script1);
    asset_nonce_list.push_back(asset_nonce1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_amount_list.clear();
    asset_script_list.clear();
    asset_nonce_list.clear();

    asset_amount_list.push_back(asset_amount);
    asset_script_list.push_back(asset_script1);
    asset_nonce_list.push_back(asset_nonce1);
    token_amount_list.push_back(token_amount1);
    token_script_list.push_back(token_script1);
    token_nonce_list.push_back(token_nonce1);
    EXPECT_THROW(param = tx.SetAssetIssuance(0, asset_amount, asset_amount_list,
                                   asset_script_list, asset_nonce_list,
                                   token_amount, token_amount_list,
                                   token_script_list, token_nonce_list,
                                   is_blind, contract_hash), CfdException);
    asset_amount_list.clear();
    asset_script_list.clear();
    asset_nonce_list.clear();
    token_amount_list.clear();
    token_script_list.clear();
    token_nonce_list.clear();
  }
}